

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O3

int Io_MvParseLiteralMv(Io_MvMod_t *p,Abc_Obj_t *pNode,char *pToken,Vec_Str_t *vFunc,int iLit)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  long lVar3;
  Io_MvMan_t *pIVar4;
  Io_MvMod_t *pIVar5;
  Io_MvMod_t *pIVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  int *piVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  char cVar15;
  ulong uVar16;
  ulong uVar17;
  char Buffer [10];
  char *local_70;
  char local_52 [10];
  Io_MvMod_t *local_48;
  Abc_Obj_t *local_40;
  int *local_38;
  
  iVar8 = (pNode->vFanins).nSize;
  if (*pToken == '=') {
    if (iVar8 < 1) {
      uVar17 = 0;
    }
    else {
      uVar17 = 0;
      do {
        pcVar9 = Abc_ObjName((Abc_Obj_t *)
                             pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar17]]);
        iVar7 = strcmp(pcVar9,pToken + 1);
        iVar8 = (pNode->vFanins).nSize;
        if (iVar7 == 0) break;
        uVar17 = uVar17 + 1;
      } while ((long)uVar17 < (long)iVar8);
    }
    if ((int)uVar17 == iVar8) {
      pVVar2 = p->pMan->vLines;
      uVar17 = (ulong)pVVar2->nSize;
      uVar14 = 0xffffffff;
      if (0 < (long)uVar17) {
        uVar16 = 0;
        do {
          if (pToken < pVVar2->pArray[uVar16]) {
            uVar14 = uVar16 & 0xffffffff;
            break;
          }
          uVar16 = uVar16 + 1;
        } while (uVar17 != uVar16);
      }
      sprintf(p->pMan->sError,
              "Line %d: Node name in the table \"%s\" cannot be found on .names line.",uVar14,
              pToken + 1);
      return 0;
    }
    uVar1 = vFunc->nSize;
    if (uVar1 == vFunc->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vFunc->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(0x10);
        }
        else {
          pcVar9 = (char *)realloc(vFunc->pArray,0x10);
        }
        vFunc->pArray = pcVar9;
        vFunc->nCap = 0x10;
      }
      else {
        sVar12 = (ulong)uVar1 * 2;
        if (vFunc->pArray == (char *)0x0) {
          pcVar9 = (char *)malloc(sVar12);
        }
        else {
          pcVar9 = (char *)realloc(vFunc->pArray,sVar12);
        }
        vFunc->pArray = pcVar9;
        vFunc->nCap = (int)sVar12;
      }
    }
    else {
      pcVar9 = vFunc->pArray;
    }
    iVar8 = vFunc->nSize;
    vFunc->nSize = iVar8 + 1;
    pcVar9[iVar8] = '=';
    sprintf(local_52,"%d",uVar17 & 0xffffffff);
    sVar12 = strlen(local_52);
    pIVar5 = local_48;
    if (0 < (int)(uint)sVar12) {
      uVar17 = 0;
      do {
        cVar15 = local_52[uVar17];
        uVar1 = vFunc->nSize;
        if (uVar1 == vFunc->nCap) {
          if ((int)uVar1 < 0x10) {
            if (vFunc->pArray == (char *)0x0) {
              pcVar9 = (char *)malloc(0x10);
            }
            else {
              pcVar9 = (char *)realloc(vFunc->pArray,0x10);
            }
            vFunc->pArray = pcVar9;
            vFunc->nCap = 0x10;
          }
          else {
            sVar13 = (ulong)uVar1 * 2;
            if (vFunc->pArray == (char *)0x0) {
              pcVar9 = (char *)malloc(sVar13);
            }
            else {
              pcVar9 = (char *)realloc(vFunc->pArray,sVar13);
            }
            vFunc->pArray = pcVar9;
            vFunc->nCap = (int)sVar13;
          }
        }
        else {
          pcVar9 = vFunc->pArray;
        }
        iVar8 = vFunc->nSize;
        vFunc->nSize = iVar8 + 1;
        pcVar9[iVar8] = cVar15;
        uVar17 = uVar17 + 1;
        pIVar5 = local_48;
      } while (((uint)sVar12 & 0x7fffffff) != uVar17);
    }
  }
  else {
    if (iVar8 <= iLit) {
      __assert_fail("iLit < Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioReadBlifMv.c"
                    ,0x694,
                    "int Io_MvParseLiteralMv(Io_MvMod_t *, Abc_Obj_t *, char *, Vec_Str_t *, int)");
    }
    if (iLit < 0) {
      piVar10 = (pNode->vFanouts).pArray;
    }
    else {
      piVar10 = (pNode->vFanins).pArray + (uint)iLit;
    }
    pObj = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*piVar10];
    piVar10 = (int *)Abc_ObjMvVar(pObj);
    if ((piVar10 == (int *)0x0) || (*(long *)(piVar10 + 2) == 0)) {
      sVar12 = strlen(pToken);
      pIVar5 = local_48;
      if (0 < (int)(uint)sVar12) {
        uVar17 = 0;
        do {
          cVar15 = pToken[uVar17];
          uVar1 = vFunc->nSize;
          if (uVar1 == vFunc->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vFunc->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(0x10);
              }
              else {
                pcVar9 = (char *)realloc(vFunc->pArray,0x10);
              }
              vFunc->pArray = pcVar9;
              vFunc->nCap = 0x10;
            }
            else {
              sVar13 = (ulong)uVar1 * 2;
              if (vFunc->pArray == (char *)0x0) {
                pcVar9 = (char *)malloc(sVar13);
              }
              else {
                pcVar9 = (char *)realloc(vFunc->pArray,sVar13);
              }
              vFunc->pArray = pcVar9;
              vFunc->nCap = (int)sVar13;
            }
          }
          else {
            pcVar9 = vFunc->pArray;
          }
          iVar8 = vFunc->nSize;
          vFunc->nSize = iVar8 + 1;
          pcVar9[iVar8] = cVar15;
          uVar17 = uVar17 + 1;
          pIVar5 = local_48;
        } while (((uint)sVar12 & 0x7fffffff) != uVar17);
      }
    }
    else {
      cVar15 = *pToken;
      local_40 = pObj;
      pIVar6 = p;
      pcVar9 = pToken;
      local_38 = piVar10;
      pIVar5 = local_48;
      while (local_48 = pIVar6, cVar15 != '\0') {
        iVar8 = Io_MvCharIsMvSymb(cVar15);
        if (iVar8 == 0) {
          sVar12 = 1;
          pcVar11 = pcVar9;
          do {
            local_70 = pcVar11;
            sVar13 = sVar12;
            if (local_70[1] == '\0') break;
            iVar8 = Io_MvCharIsMvSymb(local_70[1]);
            sVar12 = sVar13 + 1;
            pcVar11 = local_70 + 1;
          } while (iVar8 == 0);
          iVar8 = *local_38;
          if ((long)iVar8 < 1) {
            uVar17 = 0;
          }
          else {
            lVar3 = *(long *)(local_38 + 2);
            uVar17 = 0;
            while (iVar7 = strncmp(*(char **)(lVar3 + uVar17 * 8),pcVar9,sVar13), iVar7 != 0) {
              uVar17 = uVar17 + 1;
              if ((long)iVar8 == uVar17) goto LAB_00852c46;
            }
          }
          if ((int)uVar17 == iVar8) {
LAB_00852c46:
            local_70[1] = '\0';
            pIVar4 = local_48->pMan;
            pVVar2 = pIVar4->vLines;
            uVar17 = (ulong)pVVar2->nSize;
            uVar14 = 0xffffffff;
            if ((long)uVar17 < 1) goto LAB_00852cbf;
            uVar16 = 0;
            goto LAB_00852c78;
          }
          sprintf(local_52,"%d",uVar17 & 0xffffffff);
          sVar12 = strlen(local_52);
          if (0 < (int)(uint)sVar12) {
            uVar17 = 0;
            do {
              cVar15 = local_52[uVar17];
              uVar1 = vFunc->nSize;
              if (uVar1 == vFunc->nCap) {
                if ((int)uVar1 < 0x10) {
                  if (vFunc->pArray == (char *)0x0) {
                    pcVar9 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar9 = (char *)realloc(vFunc->pArray,0x10);
                  }
                  vFunc->pArray = pcVar9;
                  vFunc->nCap = 0x10;
                }
                else {
                  sVar13 = (ulong)uVar1 * 2;
                  if (vFunc->pArray == (char *)0x0) {
                    pcVar9 = (char *)malloc(sVar13);
                  }
                  else {
                    pcVar9 = (char *)realloc(vFunc->pArray,sVar13);
                  }
                  vFunc->pArray = pcVar9;
                  vFunc->nCap = (int)sVar13;
                }
              }
              else {
                pcVar9 = vFunc->pArray;
              }
              iVar8 = vFunc->nSize;
              vFunc->nSize = iVar8 + 1;
              pcVar9[iVar8] = cVar15;
              uVar17 = uVar17 + 1;
            } while (((uint)sVar12 & 0x7fffffff) != uVar17);
          }
        }
        else {
          uVar1 = vFunc->nSize;
          if (uVar1 == vFunc->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vFunc->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(0x10);
              }
              else {
                pcVar11 = (char *)realloc(vFunc->pArray,0x10);
              }
              vFunc->pArray = pcVar11;
              vFunc->nCap = 0x10;
            }
            else {
              sVar12 = (ulong)uVar1 * 2;
              if (vFunc->pArray == (char *)0x0) {
                pcVar11 = (char *)malloc(sVar12);
              }
              else {
                pcVar11 = (char *)realloc(vFunc->pArray,sVar12);
              }
              vFunc->pArray = pcVar11;
              vFunc->nCap = (int)sVar12;
            }
          }
          else {
            pcVar11 = vFunc->pArray;
          }
          iVar8 = vFunc->nSize;
          vFunc->nSize = iVar8 + 1;
          pcVar11[iVar8] = cVar15;
          local_70 = pcVar9;
        }
        pcVar9 = local_70 + 1;
        pIVar6 = local_48;
        pIVar5 = local_48;
        cVar15 = local_70[1];
      }
    }
  }
  local_48 = pIVar5;
  cVar15 = ' ';
  if (iLit == -1) {
    cVar15 = '\n';
  }
  uVar1 = vFunc->nSize;
  if (uVar1 == vFunc->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vFunc->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(0x10);
      }
      else {
        pcVar9 = (char *)realloc(vFunc->pArray,0x10);
      }
      vFunc->pArray = pcVar9;
      vFunc->nCap = 0x10;
    }
    else {
      sVar12 = (ulong)uVar1 * 2;
      if (vFunc->pArray == (char *)0x0) {
        pcVar9 = (char *)malloc(sVar12);
      }
      else {
        pcVar9 = (char *)realloc(vFunc->pArray,sVar12);
      }
      vFunc->pArray = pcVar9;
      vFunc->nCap = (int)sVar12;
    }
  }
  else {
    pcVar9 = vFunc->pArray;
  }
  iVar8 = vFunc->nSize;
  vFunc->nSize = iVar8 + 1;
  pcVar9[iVar8] = cVar15;
  return 1;
  while (uVar16 = uVar16 + 1, uVar17 != uVar16) {
LAB_00852c78:
    if (pToken < pVVar2->pArray[uVar16]) {
      uVar14 = uVar16 & 0xffffffff;
      break;
    }
  }
LAB_00852cbf:
  pcVar11 = Abc_ObjName(local_40);
  sprintf(pIVar4->sError,
          "Line %d: Cannot find value name \"%s\" among the value names of variable \"%s\".",uVar14,
          pcVar9,pcVar11);
  return 0;
}

Assistant:

static int Io_MvParseLiteralMv( Io_MvMod_t * p, Abc_Obj_t * pNode, char * pToken, Vec_Str_t * vFunc, int iLit )
{
    char Buffer[10];
    Io_MvVar_t * pVar;
    Abc_Obj_t * pFanin, * pNet;
    char * pCur, * pNext;
    int i;
    // consider the equality literal
    if ( pToken[0] == '=' )
    {
        // find the fanins
        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( !strcmp( Abc_ObjName(pFanin), pToken + 1 ) )
                break;
        if ( i == Abc_ObjFaninNum(pNode) )
        {
            sprintf( p->pMan->sError, "Line %d: Node name in the table \"%s\" cannot be found on .names line.", 
                Io_MvGetLine(p->pMan, pToken), pToken + 1 );
            return 0;
        }
        Vec_StrPush( vFunc, '=' );
        sprintf( Buffer, "%d", i );
        Vec_StrPrintStr( vFunc, Buffer );
        Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
        return 1;
    }
    // consider regular literal
    assert( iLit < Abc_ObjFaninNum(pNode) );
    pNet = iLit >= 0 ? Abc_ObjFanin(pNode, iLit) : Abc_ObjFanout0(pNode);
    pVar = (Io_MvVar_t *)Abc_ObjMvVar( pNet );
    // if the var is absent or has no symbolic values quit
    if ( pVar == NULL || pVar->pNames == NULL )
    {
        Vec_StrPrintStr( vFunc, pToken );
        Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
        return 1;
    }
    // parse the literal using symbolic values
    for ( pCur = pToken; *pCur; pCur++ )
    {
        if ( Io_MvCharIsMvSymb(*pCur) )
        {
            Vec_StrPush( vFunc, *pCur );
            continue;
        }
        // find the next MvSymb char
        for ( pNext = pCur+1; *pNext; pNext++ )
            if ( Io_MvCharIsMvSymb(*pNext) )
                break;
        // look for the value name
        for ( i = 0; i < pVar->nValues; i++ )
            if ( !strncmp( pVar->pNames[i], pCur, pNext-pCur ) )
                break;
        if ( i == pVar->nValues )
        {
            *pNext = 0;
            sprintf( p->pMan->sError, "Line %d: Cannot find value name \"%s\" among the value names of variable \"%s\".", 
                Io_MvGetLine(p->pMan, pToken), pCur, Abc_ObjName(pNet) );
            return 0;
        }
        // value name is found
        sprintf( Buffer, "%d", i );
        Vec_StrPrintStr( vFunc, Buffer );
        // update the pointer
        pCur = pNext - 1;
    }
    Vec_StrPush( vFunc, (char)((iLit == -1)? '\n' : ' ') );
    return 1;
}